

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json_options_common<wchar_t>::basic_json_options_common
          (basic_json_options_common<wchar_t> *this)

{
  this->_vptr_basic_json_options_common = (_func_int **)&PTR__basic_json_options_common_00b632c0;
  *(ushort *)&this->field_0x8 = *(ushort *)&this->field_0x8 & 0xfe00;
  (this->nan_to_num_)._M_dataplus._M_p = (pointer)&(this->nan_to_num_).field_2;
  (this->nan_to_num_)._M_string_length = 0;
  (this->nan_to_num_).field_2._M_local_buf[0] = L'\0';
  (this->inf_to_num_)._M_dataplus._M_p = (pointer)&(this->inf_to_num_).field_2;
  (this->inf_to_num_)._M_string_length = 0;
  (this->inf_to_num_).field_2._M_local_buf[0] = L'\0';
  (this->neginf_to_num_)._M_dataplus._M_p = (pointer)&(this->neginf_to_num_).field_2;
  (this->neginf_to_num_)._M_string_length = 0;
  (this->neginf_to_num_).field_2._M_local_buf[0] = L'\0';
  (this->nan_to_str_)._M_dataplus._M_p = (pointer)&(this->nan_to_str_).field_2;
  (this->nan_to_str_)._M_string_length = 0;
  (this->nan_to_str_).field_2._M_local_buf[0] = L'\0';
  (this->inf_to_str_)._M_dataplus._M_p = (pointer)&(this->inf_to_str_).field_2;
  (this->inf_to_str_)._M_string_length = 0;
  (this->inf_to_str_).field_2._M_local_buf[0] = L'\0';
  (this->neginf_to_str_)._M_dataplus._M_p = (pointer)&(this->neginf_to_str_).field_2;
  (this->neginf_to_str_)._M_string_length = 0;
  (this->neginf_to_str_).field_2._M_local_buf[0] = L'\0';
  this->max_nesting_depth_ = 0x400;
  return;
}

Assistant:

basic_json_options_common()
       :
        enable_nan_to_num_(false),
        enable_inf_to_num_(false),
        enable_neginf_to_num_(false),
        enable_nan_to_str_(false),
        enable_inf_to_str_(false),
        enable_neginf_to_str_(false),
        enable_str_to_nan_(false),
        enable_str_to_inf_(false),
        enable_str_to_neginf_(false),
        max_nesting_depth_(1024)
    {}